

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncInfo.cpp
# Opt level: O0

BOOL __thiscall FuncInfo::IsLambda(FuncInfo *this)

{
  bool bVar1;
  FuncInfo *this_local;
  
  bVar1 = Js::FunctionProxy::IsLambda(&this->byteCodeFunction->super_FunctionProxy);
  return (BOOL)bVar1;
}

Assistant:

BOOL FuncInfo::IsLambda() const
{
    return this->byteCodeFunction->IsLambda();
}